

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O3

char * proto_token(char *proto)

{
  char *pcVar1;
  char **ppcVar2;
  int iVar3;
  
  if (proto != (char *)0x0) {
    pcVar1 = *built_in_protos;
    ppcVar2 = built_in_protos;
    while (pcVar1 != (char *)0x0) {
      iVar3 = curl_strequal(pcVar1,proto);
      if (iVar3 != 0) {
        return *ppcVar2;
      }
      pcVar1 = ppcVar2[1];
      ppcVar2 = ppcVar2 + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *proto_token(const char *proto)
{
  const char * const *builtin;

  if(!proto)
    return NULL;
  for(builtin = built_in_protos; *builtin; builtin++)
    if(curl_strequal(*builtin, proto))
      break;
  return *builtin;
}